

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<float>::MultAdd
          (TPZMatrix<float> *this,TPZFMatrix<float> *x,TPZFMatrix<float> *y,TPZFMatrix<float> *z,
          float alpha,float beta,int opt)

{
  float fVar1;
  float *pfVar2;
  long lVar3;
  long col;
  long lVar4;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float val;
  float local_5c;
  int local_58;
  float local_54;
  long local_50;
  float local_48;
  float local_44;
  long local_40;
  long local_38;
  
  local_58 = opt;
  local_54 = alpha;
  if (opt == 0) {
    lVar3 = (this->super_TPZBaseMatrix).fCol;
    if (lVar3 == (x->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow) goto LAB_00d13893;
  }
  else {
    lVar3 = (x->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow;
LAB_00d13893:
    if ((this->super_TPZBaseMatrix).fRow == lVar3) goto LAB_00d138a8;
  }
  Error("Operator* <matrices with incompatible dimensions>",(char *)0x0);
LAB_00d138a8:
  local_50 = (x->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol;
  if ((local_50 != (y->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol) ||
     ((x->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow !=
      (y->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow)) {
    Error("TPZFMatrix::MultiplyAdd incompatible dimensions\n",(char *)0x0);
    local_50 = (x->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol;
  }
  lVar3 = (this->super_TPZBaseMatrix).fRow;
  lVar4 = (this->super_TPZBaseMatrix).fCol;
  PrepareZ(this,y,z,beta,local_58);
  local_5c = 0.0;
  col = 0;
  local_38 = lVar4;
  if (lVar4 < 1) {
    local_38 = col;
  }
  local_40 = lVar3;
  if (lVar3 < 1) {
    local_40 = col;
  }
  if (local_50 < 1) {
    local_50 = col;
  }
  for (; col != local_50; col = col + 1) {
    if (local_58 == 0) {
      for (lVar3 = 0; lVar3 != local_38; lVar3 = lVar3 + 1) {
        for (lVar4 = 0; local_40 != lVar4; lVar4 = lVar4 + 1) {
          pfVar2 = TPZFMatrix<float>::operator()(z,lVar4,col);
          fVar1 = *pfVar2;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar4,lVar3);
          local_48 = extraout_XMM0_Da_01 * local_54;
          (*(x->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24])
                    (x,lVar3,col);
          local_5c = extraout_XMM0_Da_02 * local_48 + fVar1;
          (*(z->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x23])
                    (z,lVar4,col,&local_5c);
        }
      }
    }
    else {
      for (lVar3 = 0; lVar3 != local_40; lVar3 = lVar3 + 1) {
        local_5c = 0.0;
        for (lVar4 = 0; local_38 != lVar4; lVar4 = lVar4 + 1) {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar4,lVar3);
          (*(x->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24])
                    (x,lVar4,col);
          local_5c = extraout_XMM0_Da_00 * extraout_XMM0_Da + local_5c;
        }
        local_44 = local_5c * local_54;
        (*(z->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x23])
                  (z,lVar3,col,&local_44);
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z, const TVar alpha,const TVar beta,const int opt) const {
	if ((!opt && Cols() != x.Rows()) || Rows() != x.Rows())
		Error( "Operator* <matrices with incompatible dimensions>" );
	if(x.Cols() != y.Cols() || x.Rows() != y.Rows()) {
		Error ("TPZFMatrix::MultiplyAdd incompatible dimensions\n");
	}
	int64_t rows = Rows();
	int64_t cols = Cols();
	int64_t xcols = x.Cols();
	int64_t ic, c, r;
	PrepareZ(y,z,beta,opt);
	TVar val = 0.;
	for (ic = 0; ic < xcols; ic++) {
		if(!opt) {
			for ( c = 0; c<cols; c++) {
				for ( r = 0; r < rows; r++ ) {
					val = z(r,ic) + alpha * GetVal(r,c) * x.GetVal(c,ic);
					z.PutVal(r,ic,val);
				}
			}
		} else {
			for (r = 0; r<rows; r++) {
            	val = 0.;
				for(c = 0; c<cols; c++) {
					val += GetVal(c,r)* x.GetVal(c,ic);
				}
				z.PutVal(r,ic,alpha*val);
			}
		}
	}
}